

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeVariables
          (cmLocalUnixMakefileGenerator3 *this,ostream *makefileStream)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  ulong uVar4;
  char *pcVar5;
  allocator local_159;
  string local_158;
  string local_138;
  string local_118;
  allocator local_f1;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string cmakeShellCommand;
  cmGlobalUnixMakefileGenerator3 *gg;
  ostream *makefileStream_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  WriteDivider(this,makefileStream);
  poVar2 = std::operator<<(makefileStream,"# Set environment variables for the build.\n");
  std::operator<<(poVar2,"\n");
  cmakeShellCommand.field_2._8_8_ =
       (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  if (((((cmGlobalGenerator *)(cmakeShellCommand.field_2._8_8_ + 0x5c8))->MakeSilentFlag).field_2.
       _M_local_buf[0] & 1U) != 0) {
    poVar2 = std::operator<<(makefileStream,"!IF \"$(OS)\" == \"Windows_NT\"\n");
    poVar2 = std::operator<<(poVar2,"NULL=\n");
    poVar2 = std::operator<<(poVar2,"!ELSE\n");
    poVar2 = std::operator<<(poVar2,"NULL=nul\n");
    std::operator<<(poVar2,"!ENDIF\n");
  }
  bVar1 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
  if (bVar1) {
    poVar2 = std::operator<<(makefileStream,"SHELL = cmd.exe\n");
    std::operator<<(poVar2,"\n");
  }
  else {
    poVar2 = std::operator<<(makefileStream,"# The shell in which to execute make rules.\n");
    poVar2 = std::operator<<(poVar2,"SHELL = /bin/sh\n");
    std::operator<<(poVar2,"\n");
  }
  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  MaybeConvertWatcomShellCommand((string *)local_40,this,psVar3);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmsys::SystemTools::CollapseFullPath(&local_80,psVar3);
    cmOutputConverter::ConvertToOutputFormat
              (&local_60,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               &local_80,SHELL);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  poVar2 = std::operator<<(makefileStream,"# The CMake executable.\n");
  poVar2 = std::operator<<(poVar2,"CMAKE_COMMAND = ");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(makefileStream,"# The command to remove a file.\n");
  poVar2 = std::operator<<(poVar2,"RM = ");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  poVar2 = std::operator<<(poVar2," -E remove -f\n");
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(makefileStream,"# Escaping for special characters.\n");
  poVar2 = std::operator<<(poVar2,"EQUALS = =\n");
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(makefileStream,
                           "# The top-level source directory on which CMake was run.\n");
  poVar2 = std::operator<<(poVar2,"CMAKE_SOURCE_DIR = ");
  pcVar5 = cmLocalGenerator::GetSourceDirectory((cmLocalGenerator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,pcVar5,&local_f1);
  cmsys::SystemTools::CollapseFullPath(&local_d0,&local_f0);
  cmOutputConverter::ConvertToOutputFormat
            (&local_b0,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_d0,SHELL);
  poVar2 = std::operator<<(poVar2,(string *)&local_b0);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  poVar2 = std::operator<<(makefileStream,
                           "# The top-level build directory on which CMake was run.\n");
  poVar2 = std::operator<<(poVar2,"CMAKE_BINARY_DIR = ");
  pcVar5 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,pcVar5,&local_159);
  cmsys::SystemTools::CollapseFullPath(&local_138,&local_158);
  cmOutputConverter::ConvertToOutputFormat
            (&local_118,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_138,SHELL);
  poVar2 = std::operator<<(poVar2,(string *)&local_118);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeVariables(
  std::ostream& makefileStream)
{
  this->WriteDivider(makefileStream);
  makefileStream << "# Set environment variables for the build.\n"
                 << "\n";
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if (gg->DefineWindowsNULL) {
    makefileStream << "!IF \"$(OS)\" == \"Windows_NT\"\n"
                   << "NULL=\n"
                   << "!ELSE\n"
                   << "NULL=nul\n"
                   << "!ENDIF\n";
  }
  if (this->IsWindowsShell()) {
    makefileStream << "SHELL = cmd.exe\n"
                   << "\n";
  } else {
#if !defined(__VMS)
    /* clang-format off */
      makefileStream
        << "# The shell in which to execute make rules.\n"
        << "SHELL = /bin/sh\n"
        << "\n";
/* clang-format on */
#endif
  }

  std::string cmakeShellCommand =
    this->MaybeConvertWatcomShellCommand(cmSystemTools::GetCMakeCommand());
  if (cmakeShellCommand.empty()) {
    cmakeShellCommand = this->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(cmSystemTools::GetCMakeCommand()),
      cmOutputConverter::SHELL);
  }

  /* clang-format off */
  makefileStream
    << "# The CMake executable.\n"
    << "CMAKE_COMMAND = "
    << cmakeShellCommand
    << "\n"
    << "\n";
  makefileStream
    << "# The command to remove a file.\n"
    << "RM = "
    << cmakeShellCommand
    << " -E remove -f\n"
    << "\n";
  makefileStream
    << "# Escaping for special characters.\n"
    << "EQUALS = =\n"
    << "\n";
  makefileStream
    << "# The top-level source directory on which CMake was run.\n"
    << "CMAKE_SOURCE_DIR = "
    << this->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(this->GetSourceDirectory()),
                     cmOutputConverter::SHELL)
    << "\n"
    << "\n";
  makefileStream
    << "# The top-level build directory on which CMake was run.\n"
    << "CMAKE_BINARY_DIR = "
    << this->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(this->GetBinaryDirectory()),
                     cmOutputConverter::SHELL)
    << "\n"
    << "\n";
  /* clang-format on */
}